

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall
SQVM::ArithMetaMethod(SQVM *this,SQInteger op,SQObjectPtr *o1,SQObjectPtr *o2,SQObjectPtr *dest)

{
  SQTable *pSVar1;
  bool bVar2;
  int iVar3;
  SQChar *pSVar4;
  SQChar *pSVar5;
  SQMetaMethod mm;
  SQObjectPtr closure;
  SQObjectPtr local_40;
  
  if ((op - 0x25U < 0xb) && ((0x561U >> ((uint)(op - 0x25U) & 0x1f) & 1) != 0)) {
    if ((((o1->super_SQObject)._type & 0x2000000) != 0) &&
       (pSVar1 = (o1->super_SQObject)._unVal.pTable,
       (pSVar1->super_SQDelegable)._delegate != (SQTable *)0x0)) {
      local_40.super_SQObject._type = OT_NULL;
      local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
      iVar3 = (*(pSVar1->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                _vptr_SQRefCounted[6])(pSVar1,this,(ulong)(&UINT_001712b4)[op]);
      if ((char)iVar3 != '\0') {
        Push(this,o1);
        Push(this,o2);
        bVar2 = CallMetaMethod(this,&local_40,mm,2,dest);
        SQObjectPtr::~SQObjectPtr(&local_40);
        return bVar2;
      }
      SQObjectPtr::~SQObjectPtr(&local_40);
    }
    pSVar4 = GetTypeName(o1);
    pSVar5 = GetTypeName(o2);
    Raise_Error(this,"arith op %c on between \'%s\' and \'%s\'",op,pSVar4,pSVar5);
    return false;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqvm.cpp"
                ,0xa3,
                "bool SQVM::ArithMetaMethod(SQInteger, const SQObjectPtr &, const SQObjectPtr &, SQObjectPtr &)"
               );
}

Assistant:

bool SQVM::ArithMetaMethod(SQInteger op,const SQObjectPtr &o1,const SQObjectPtr &o2,SQObjectPtr &dest)
{
    SQMetaMethod mm;
    switch(op){
        case _SC('+'): mm=MT_ADD; break;
        case _SC('-'): mm=MT_SUB; break;
        case _SC('/'): mm=MT_DIV; break;
        case _SC('*'): mm=MT_MUL; break;
        case _SC('%'): mm=MT_MODULO; break;
        default: mm = MT_ADD; assert(0); break; //shutup compiler
    }
    if(is_delegable(o1) && _delegable(o1)->_delegate) {

        SQObjectPtr closure;
        if(_delegable(o1)->GetMetaMethod(this, mm, closure)) {
            Push(o1);Push(o2);
            return CallMetaMethod(closure,mm,2,dest);
        }
    }
    Raise_Error(_SC("arith op %c on between '%s' and '%s'"),op,GetTypeName(o1),GetTypeName(o2));
    return false;
}